

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_add_with_descr(REF_GEOM ref_geom,REF_INT *descr,REF_DBL *param)

{
  REF_INT type;
  REF_INT id;
  REF_INT RVar1;
  REF_INT node;
  REF_INT *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_INT geom;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  type = *descr;
  id = descr[1];
  local_48 = *(undefined8 *)(descr + 2);
  uStack_40 = 0;
  RVar1 = descr[4];
  node = descr[5];
  uVar3 = ref_geom_add(ref_geom,node,type,id,param);
  if (uVar3 == 0) {
    uVar3 = ref_geom_find(ref_geom,node,type,id,&local_4c);
    if (uVar3 == 0) {
      pRVar2 = ref_geom->descr;
      pRVar2[(long)local_4c * 6 + 4] = RVar1;
      *(undefined8 *)(pRVar2 + (long)local_4c * 6 + 2) = local_48;
      return 0;
    }
    pcVar5 = "geom find";
    uVar4 = 0x1f9;
  }
  else {
    pcVar5 = "geom add";
    uVar4 = 0x1f8;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_add_with_descr",(ulong)uVar3,pcVar5);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_with_descr(REF_GEOM ref_geom, REF_INT *descr,
                                           REF_DBL *param) {
  REF_INT type, id, gref, jump, degen, node, geom;
  type = descr[REF_GEOM_DESCR_TYPE];
  id = descr[REF_GEOM_DESCR_ID];
  gref = descr[REF_GEOM_DESCR_GREF];
  jump = descr[REF_GEOM_DESCR_JUMP];
  degen = descr[REF_GEOM_DESCR_DEGEN];
  node = descr[REF_GEOM_DESCR_NODE];
  RSS(ref_geom_add(ref_geom, node, type, id, param), "geom add");
  RSS(ref_geom_find(ref_geom, node, type, id, &geom), "geom find");
  ref_geom_gref(ref_geom, geom) = gref;
  ref_geom_degen(ref_geom, geom) = degen;
  ref_geom_jump(ref_geom, geom) = jump;
  return REF_SUCCESS;
}